

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoparticleBuilderCmd.cpp
# Opt level: O0

void print_help_common(void)

{
  size_t sVar1;
  
  cmdline_parser_print_version();
  sVar1 = strlen(gengetopt_args_info_purpose);
  if (sVar1 != 0) {
    printf("\n%s\n",gengetopt_args_info_purpose);
  }
  sVar1 = strlen(gengetopt_args_info_usage);
  if (sVar1 != 0) {
    printf("\n%s\n",gengetopt_args_info_usage);
  }
  printf("\n");
  sVar1 = strlen(gengetopt_args_info_description);
  if (sVar1 != 0) {
    printf("%s\n\n",gengetopt_args_info_description);
  }
  return;
}

Assistant:

static void print_help_common(void) {
  cmdline_parser_print_version ();

  if (strlen(gengetopt_args_info_purpose) > 0)
    printf("\n%s\n", gengetopt_args_info_purpose);

  if (strlen(gengetopt_args_info_usage) > 0)
    printf("\n%s\n", gengetopt_args_info_usage);

  printf("\n");

  if (strlen(gengetopt_args_info_description) > 0)
    printf("%s\n\n", gengetopt_args_info_description);
}